

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O3

void __thiscall icu_63::NFRule::setBaseValue(NFRule *this,int64_t newBaseValue,UErrorCode *status)

{
  NFSubstitution *pNVar1;
  int16_t iVar2;
  
  this->baseValue = newBaseValue;
  this->radix = 10;
  if (newBaseValue < 1) {
    this->exponent = 0;
  }
  else {
    iVar2 = expectedExponent(this);
    this->exponent = iVar2;
    pNVar1 = this->sub1;
    if (pNVar1 != (NFSubstitution *)0x0) {
      (*(pNVar1->super_UObject)._vptr_UObject[4])
                (pNVar1,(ulong)(uint)this->radix,(ulong)(uint)(int)iVar2,status);
    }
    pNVar1 = this->sub2;
    if (pNVar1 != (NFSubstitution *)0x0) {
      (*(pNVar1->super_UObject)._vptr_UObject[4])
                (pNVar1,(ulong)(uint)this->radix,(ulong)(uint)(int)this->exponent,status);
      return;
    }
  }
  return;
}

Assistant:

void
NFRule::setBaseValue(int64_t newBaseValue, UErrorCode& status)
{
    // set the base value
    baseValue = newBaseValue;
    radix = 10;

    // if this isn't a special rule, recalculate the radix and exponent
    // (the radix always defaults to 10; if it's supposed to be something
    // else, it's cleaned up by the caller and the exponent is
    // recalculated again-- the only function that does this is
    // NFRule.parseRuleDescriptor() )
    if (baseValue >= 1) {
        exponent = expectedExponent();

        // this function gets called on a fully-constructed rule whose
        // description didn't specify a base value.  This means it
        // has substitutions, and some substitutions hold on to copies
        // of the rule's divisor.  Fix their copies of the divisor.
        if (sub1 != NULL) {
            sub1->setDivisor(radix, exponent, status);
        }
        if (sub2 != NULL) {
            sub2->setDivisor(radix, exponent, status);
        }

        // if this is a special rule, its radix and exponent are basically
        // ignored.  Set them to "safe" default values
    } else {
        exponent = 0;
    }
}